

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftDown(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,size_t idx)

{
  Node *pNVar1;
  _Head_base<0UL,_Rml::Context_*,_false> _Var2;
  pointer pcVar3;
  uint8_t *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  byte bVar6;
  InfoType IVar7;
  long lVar8;
  
  puVar4 = this->mInfo;
  bVar6 = puVar4[idx + 1];
  IVar7 = this->mInfoInc;
  if (IVar7 * 2 <= (uint)bVar6) {
    lVar8 = idx * 0x28;
    do {
      puVar4[idx] = bVar6 - (char)IVar7;
      pNVar1 = this->mKeyVals;
      std::__cxx11::string::operator=
                ((string *)((long)&(pNVar1->mData).first._M_dataplus._M_p + lVar8),
                 (string *)((long)&pNVar1[1].mData.first._M_dataplus._M_p + lVar8));
      std::__uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>::operator=
                ((__uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_> *)
                 ((long)&(pNVar1->mData).second._M_t.
                         super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
                         super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_> +
                 lVar8),(__uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_> *)
                        ((long)&pNVar1[1].mData.second._M_t.
                                super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>
                        + lVar8));
      puVar4 = this->mInfo;
      bVar6 = puVar4[idx + 2];
      IVar7 = this->mInfoInc;
      idx = idx + 1;
      lVar8 = lVar8 + 0x28;
    } while (IVar7 * 2 <= (uint)bVar6);
  }
  puVar4[idx] = '\0';
  pNVar1 = this->mKeyVals;
  _Var2._M_head_impl =
       pNVar1[idx].mData.second._M_t.
       super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
       super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Context *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_ScriptInterface + 0x10))();
  }
  pNVar1 = pNVar1 + idx;
  (pNVar1->mData).second._M_t.super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t
  .super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
  super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl = (Context *)0x0;
  pcVar3 = (pNVar1->mData).first._M_dataplus._M_p;
  paVar5 = &(pNVar1->mData).first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void shiftDown(size_t idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        // until we find one that is either empty or has zero offset.
        // TODO(martinus) we don't need to move everything, just the last one for the same
        // bucket.
        mKeyVals[idx].destroy(*this);

        // until we find one that is either empty or has zero offset.
        while (mInfo[idx + 1] >= 2 * mInfoInc) {
            ROBIN_HOOD_COUNT(shiftDown)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx + 1] - mInfoInc);
            mKeyVals[idx] = std::move(mKeyVals[idx + 1]);
            ++idx;
        }

        mInfo[idx] = 0;
        // don't destroy, we've moved it
        // mKeyVals[idx].destroy(*this);
        mKeyVals[idx].~Node();
    }